

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O0

int adios2::utils::compile_regexp_masks(void)

{
  int i;
  char buf [256];
  int errcode;
  int local_10c;
  char local_108 [256];
  int local_8;
  
  local_10c = 0;
  while( true ) {
    if (nmasks <= local_10c) {
      return 0;
    }
    local_8 = regcomp((regex_t *)(varregex + (long)local_10c * 0x40),
                      *(char **)(varmask + (long)local_10c * 8),1);
    if (local_8 != 0) break;
    local_10c = local_10c + 1;
    local_8 = 0;
  }
  regerror(local_8,(regex_t *)(varregex + (long)local_10c * 0x40),local_108,0x100);
  fprintf(_stderr,"Error: \"%s\" is an invalid extended regular expression: %s\n",
          *(undefined8 *)(varmask + (long)local_10c * 8),local_108);
  return 2;
}

Assistant:

int compile_regexp_masks(void)
{
#ifdef USE_C_REGEX
    int errcode;
    char buf[256];
    for (int i = 0; i < nmasks; i++)
    {
        errcode = regcomp(&(varregex[i]), varmask[i], REG_EXTENDED);
        if (errcode)
        {
            regerror(errcode, &(varregex[i]), buf, sizeof(buf));
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression: %s\n",
                    varmask[i], buf);
            return 2;
        }
    }
#else
    varregex.reserve(nmasks);
    for (int i = 0; i < nmasks; i++)
    {
        try
        {
            varregex.push_back(std::regex(varmask[i]));
        }
        catch (std::regex_error &e)
        {
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression. C++ regex error code: %d\n",
                    varmask[i], e.code() == std::regex_constants::error_badrepeat);
            return 2;
        }
    }
#endif
    return 0;
}